

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent.cpp
# Opt level: O0

void __thiscall
libtorrent::aux::torrent::update_peer_port
          (torrent *this,int port,torrent_peer *p,peer_source_flags_t src)

{
  pointer this_00;
  undefined1 local_d8 [8];
  torrent_state st;
  torrent_peer *p_local;
  int port_local;
  torrent *this_local;
  peer_source_flags_t src_local;
  
  st.erased.
  super__Vector_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)p;
  need_peer_list(this);
  get_peer_list_state((torrent_state *)local_d8,this);
  this_00 = ::std::
            unique_ptr<libtorrent::aux::peer_list,_std::default_delete<libtorrent::aux::peer_list>_>
            ::operator->(&(this->super_torrent_hot_members).m_peer_list);
  peer_list::update_peer_port
            (this_00,port,
             (torrent_peer *)
             st.erased.
             super__Vector_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage,src,(torrent_state *)local_d8);
  peers_erased(this,(vector<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                     *)&st.port);
  update_want_peers(this);
  torrent_state::~torrent_state((torrent_state *)local_d8);
  return;
}

Assistant:

void torrent::update_peer_port(int const port, torrent_peer* p
		, peer_source_flags_t const src)
	{
		need_peer_list();
		torrent_state st = get_peer_list_state();
		m_peer_list->update_peer_port(port, p, src, &st);
		peers_erased(st.erased);
		update_want_peers();
	}